

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

void Ivy_ManTestCutsAll(Ivy_Man_t *p)

{
  abctime aVar1;
  Ivy_Obj_t *pObj;
  abctime aVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  aVar1 = Abc_Clock();
  uVar4 = -(p->nObjs[5] + p->nObjs[6]);
  uVar6 = 0;
  uVar5 = 0;
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,iVar3);
    if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
      Ivy_NodeFindCutsAll(p,pObj,5);
      uVar4 = uVar4 + Ivy_NodeFindCutsAll::CutStore.nCuts;
      uVar5 = uVar5 + (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100);
      uVar6 = uVar6 + 1;
    }
  }
  iVar3 = 0x8e53c8;
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)uVar4,
         (ulong)(uint)(p->nObjs[5] + p->nObjs[1] + p->nObjs[6]),(ulong)uVar6,(ulong)uVar5);
  Abc_Print(iVar3,"%s =","Time");
  aVar2 = Abc_Clock();
  Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
  return;
}

Assistant:

void Ivy_ManTestCutsAll( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        nCutsCut    = Ivy_NodeFindCutsAll( p, pObj, 5 )->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}